

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

ostream * std::operator<<(ostream *stream,view_type *value)

{
  const_pointer pvVar1;
  value_type *item;
  const_pointer __end1;
  const_pointer __begin1;
  view_type *__range1;
  view_type *value_local;
  ostream *stream_local;
  
  __end1 = trial::protocol::core::detail::span<char>::begin(value);
  pvVar1 = trial::protocol::core::detail::span<char>::end(value);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    std::operator<<(stream,*__end1);
  }
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream,
                          const decoder_type::view_type& value)
{
    for (auto&& item : value)
    {
        stream << item;
    }
    return stream;
}